

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artitele.cpp
# Opt level: O0

bool P_AutoUseChaosDevice(player_t *player)

{
  APlayerPawn *this;
  PClassActor *type;
  AInventory *pAVar1;
  int iVar2;
  AInventory *arti;
  player_t *player_local;
  
  this = player->mo;
  type = PClass::FindActor("ArtiTeleport");
  pAVar1 = AActor::FindInventory(&this->super_AActor,type,false);
  if (pAVar1 != (AInventory *)0x0) {
    (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1d])
              (player->mo,pAVar1);
    iVar2 = (player->health + 1) / 2;
    (player->mo->super_AActor).health = iVar2;
    player->health = iVar2;
  }
  return pAVar1 != (AInventory *)0x0;
}

Assistant:

bool P_AutoUseChaosDevice (player_t *player)
{
	AInventory *arti = player->mo->FindInventory(PClass::FindActor("ArtiTeleport"));

	if (arti != NULL)
	{
		player->mo->UseInventory (arti);
		player->health = player->mo->health = (player->health+1)/2;
		return true;
	}
	return false;
}